

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::get
          (FieldGeneratorMap *this,FieldDescriptor *field)

{
  LogMessage *other;
  char *pcVar1;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *this_00;
  FieldGenerator *pFVar2;
  int in_EDX;
  int extraout_EDX;
  LogFinisher local_51;
  LogMessage local_50;
  
  other = (LogMessage *)field;
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x86);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    in_EDX = extraout_EDX;
  }
  pcVar1 = FieldDescriptor::index(field,(char *)other,in_EDX);
  this_00 = internal::
            scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
            ::operator[](&this->field_generators_,(long)(int)pcVar1);
  pFVar2 = internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::operator*(this_00)
  ;
  return pFVar2;
}

Assistant:

const FieldGenerator& FieldGeneratorMap::get(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}